

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O3

Byte * z7_BranchConv_SPARC_Dec(Byte *data,SizeT size,UInt32 pc)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = 0xffffff - pc;
  for (uVar2 = 0; (size & 0xfffffffffffffffc) != uVar2; uVar2 = uVar2 + 4) {
    uVar3 = *(uint *)(data + uVar2);
    uVar3 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) << 2 |
            (uVar3 << 0x18) >> 0x1e;
    if ((uVar3 + 0xffffff & 0xfe000003) == 0) {
      uVar4 = (uVar3 + iVar1 & 0x1ffffff) - 0xffffff;
      uVar3 = uVar4 >> 2;
      *(uint *)(data + uVar2) =
           (uVar4 * 0x40000000 | uVar3) >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
           uVar3 << 0x18;
    }
    iVar1 = iVar1 + -4;
  }
  return data + (size & 0xfffffffffffffffc);
}

Assistant:

Z7_BRANCH_FUNC_MAIN(BranchConv_SPARC)
{
  // Byte *p = data;
  const Byte *lim;
  const UInt32 flag = (UInt32)1 << 22;
  size &= ~(SizeT)3;
  lim = p + size;
  BR_PC_INIT
  pc -= 4;  // because (p) will point to next instruction
  for (;;)
  {
    UInt32 v;
    for (;;)
    {
      if Z7_UNLIKELY(p == lim)
        return p;
      /* // the code without GetBe32a():
      { const UInt32 v = GetUi16a(p) & 0xc0ff; p += 4; if (v == 0x40 || v == 0xc07f) break; }
      */
      v = GetBe32a(p);
      p += 4;
    #ifdef BR_SPARC_USE_ROTATE
      v = rotlFixed(v, 2);
      v += (flag << 2) - 1;
      if Z7_UNLIKELY((v & (3 - (flag << 3))) == 0)
    #else
      v += (UInt32)5 << 29;
      v ^= (UInt32)7 << 29;
      v += flag;
      if Z7_UNLIKELY((v & (0 - (flag << 1))) == 0)
    #endif
        break;
    }
    {
      // UInt32 v = GetBe32a(p - 4);
    #ifndef BR_SPARC_USE_ROTATE
      v <<= 2;
    #endif
      {
        UInt32 c = BR_PC_GET;
        BR_CONVERT_VAL(v, c)
      }
      v &= (flag << 3) - 1;
    #ifdef BR_SPARC_USE_ROTATE
      v -= (flag << 2) - 1;
      v = rotrFixed(v, 2);
    #else
      v -= (flag << 2);
      v >>= 2;
      v |= (UInt32)1 << 30;
    #endif
      SetBe32a(p - 4, v)
    }
  }
}